

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdPatternColorR5G5B5::~MthdPatternColorR5G5B5(MthdPatternColorR5G5B5 *this)

{
  MthdPatternColorR5G5B5 *this_local;
  
  ~MthdPatternColorR5G5B5(this);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = nv04_pgraph_hswap(&exp, val);
		for (int i = 0; i < 2; i++) {
			uint8_t b = extr(rval, i * 16 + 0, 5) * 0x21 >> 2;
			uint8_t g = extr(rval, i * 16 + 5, 5) * 0x21 >> 2;
			uint8_t r = extr(rval, i * 16 + 10, 5) * 0x21 >> 2;
			exp.pattern_color[idx*2+i] = b | g << 8 | r << 16;
		}
	}